

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spe-impl.inc.c
# Opt level: O0

void gen_evmwsmi(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  uint32_t uVar1;
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  TCGv_i64 t1;
  TCGv_i64 t0;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if (((ctx->spe_enabled ^ 0xffU) & 1) == 0) {
    ret = tcg_temp_new_i64(tcg_ctx_00);
    ret_00 = tcg_temp_new_i64(tcg_ctx_00);
    uVar1 = rA(ctx->opcode);
    tcg_gen_mov_i64_ppc64(tcg_ctx_00,ret,cpu_gpr[uVar1]);
    tcg_gen_ext32s_i64_ppc64(tcg_ctx_00,ret,ret);
    uVar1 = rB(ctx->opcode);
    tcg_gen_mov_i64_ppc64(tcg_ctx_00,ret_00,cpu_gpr[uVar1]);
    tcg_gen_ext32s_i64_ppc64(tcg_ctx_00,ret_00,ret_00);
    tcg_gen_mul_i64_ppc64(tcg_ctx_00,ret,ret,ret_00);
    uVar1 = rD(ctx->opcode);
    gen_store_gpr64(tcg_ctx_00,uVar1,ret);
    tcg_temp_free_i64(tcg_ctx_00,ret);
    tcg_temp_free_i64(tcg_ctx_00,ret_00);
  }
  else {
    gen_exception(ctx,0x20);
  }
  return;
}

Assistant:

static inline void gen_evmwsmi(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i64 t0, t1;

    if (unlikely(!ctx->spe_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_SPEU);
        return;
    }

    t0 = tcg_temp_new_i64(tcg_ctx);
    t1 = tcg_temp_new_i64(tcg_ctx);

    /* t0 := rA; t1 := rB */
    tcg_gen_extu_tl_i64(tcg_ctx, t0, cpu_gpr[rA(ctx->opcode)]);
    tcg_gen_ext32s_i64(tcg_ctx, t0, t0);
    tcg_gen_extu_tl_i64(tcg_ctx, t1, cpu_gpr[rB(ctx->opcode)]);
    tcg_gen_ext32s_i64(tcg_ctx, t1, t1);

    tcg_gen_mul_i64(tcg_ctx, t0, t0, t1);  /* t0 := rA * rB */

    gen_store_gpr64(tcg_ctx, rD(ctx->opcode), t0); /* rD := t0 */

    tcg_temp_free_i64(tcg_ctx, t0);
    tcg_temp_free_i64(tcg_ctx, t1);
}